

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O1

bool __thiscall
draco::DecoderBuffer::DecodeLeastSignificantBits32
          (DecoderBuffer *this,uint32_t nbits,uint32_t *out_value)

{
  uint32_t uVar1;
  uint uVar2;
  byte *pbVar3;
  uint32_t uVar4;
  size_t sVar5;
  bool bVar6;
  
  if (this->bit_mode_ == true) {
    bVar6 = nbits < 0x21;
    if (bVar6) {
      if (nbits == 0) {
        uVar4 = 0;
      }
      else {
        sVar5 = (this->bit_decoder_).bit_offset_;
        uVar1 = 0;
        uVar4 = 0;
        do {
          pbVar3 = (this->bit_decoder_).bit_buffer_ + (sVar5 >> 3);
          if (pbVar3 < (this->bit_decoder_).bit_buffer_end_) {
            uVar2 = (uint)((*pbVar3 >> ((uint)sVar5 & 7) & 1) != 0);
            sVar5 = sVar5 + 1;
            (this->bit_decoder_).bit_offset_ = sVar5;
          }
          else {
            uVar2 = 0;
          }
          uVar4 = uVar4 | uVar2 << ((byte)uVar1 & 0x1f);
          uVar1 = uVar1 + 1;
        } while (nbits != uVar1);
      }
      *out_value = uVar4;
      return bVar6;
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool DecodeLeastSignificantBits32(uint32_t nbits, uint32_t *out_value) {
    if (!bit_decoder_active()) {
      return false;
    }
    return bit_decoder_.GetBits(nbits, out_value);
  }